

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

TValue * luaT_gettm(Table *events,TMS event,TString *ename)

{
  TValue *tm;
  TString *ename_local;
  TMS event_local;
  Table *events_local;
  
  events_local = (Table *)luaH_getshortstr(events,ename);
  if (*(int *)&events_local->tt == 0) {
    events->flags = events->flags | (byte)(1 << ((byte)event & 0x1f));
    events_local = (Table *)0x0;
  }
  return (TValue *)events_local;
}

Assistant:

const TValue *luaT_gettm(Table *events, TMS event, TString *ename) {
    const TValue *tm = luaH_getshortstr(events, ename);
    lua_assert(event <= TM_EQ);
    if (ttisnil(tm)) {  /* no tag method? */
        events->flags |= cast_byte(1u << event);  /* cache this fact */
        return NULL;
    } else return tm;
}